

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# purearrayfactory.cpp
# Opt level: O0

void __thiscall PureArrayFactory::PureArrayFactory(PureArrayFactory *this,int range,int w,int h)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Array **ppAVar3;
  int local_20;
  int i;
  int h_local;
  int w_local;
  int range_local;
  PureArrayFactory *this_local;
  
  this->_vptr_PureArrayFactory = (_func_int **)&PTR__PureArrayFactory_00104da0;
  this->_range = range;
  this->_width = w;
  this->_height = h;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->_range;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  ppAVar3 = (Array **)operator_new__(uVar2);
  this->_arrays = ppAVar3;
  for (local_20 = 0; local_20 < this->_range; local_20 = local_20 + 1) {
    this->_arrays[local_20] = (Array *)0x0;
  }
  return;
}

Assistant:

PureArrayFactory::PureArrayFactory(int range, int w, int h)
	:_range(range)
	,_width(w)
	,_height(h)
{
	_arrays = new Array*[_range];

	for (int i = 0; i < _range; ++i) {
		_arrays[i] = NULL;
	}
}